

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

int __thiscall OpenMD::SelectionCompiler::getHexitValue(SelectionCompiler *this,char ch)

{
  char ch_local;
  SelectionCompiler *this_local;
  undefined4 local_4;
  
  if ((ch < '0') || ('9' < ch)) {
    if ((ch < 'a') || ('f' < ch)) {
      if ((ch < 'A') || ('F' < ch)) {
        local_4 = -1;
      }
      else {
        local_4 = ch + -0x37;
      }
    }
    else {
      local_4 = ch + -0x57;
    }
  }
  else {
    local_4 = ch + -0x30;
  }
  return local_4;
}

Assistant:

int SelectionCompiler::getHexitValue(char ch) {
    if (ch >= '0' && ch <= '9')
      return ch - '0';
    else if (ch >= 'a' && ch <= 'f')
      return 10 + ch - 'a';
    else if (ch >= 'A' && ch <= 'F')
      return 10 + ch - 'A';
    else
      return -1;
  }